

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_chdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  char *__path;
  int *piVar2;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue JVar5;
  
  JVar4.float64 = 0.0;
  __path = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__path == (char *)0x0) {
    iVar3 = 6;
  }
  else {
    uVar1 = chdir(__path);
    if (uVar1 == 0xffffffff) {
      piVar2 = __errno_location();
      uVar1 = -*piVar2;
    }
    JS_FreeCString(ctx,__path);
    JVar4._4_4_ = 0;
    JVar4.int32 = uVar1;
    iVar3 = 0;
  }
  JVar5.tag = iVar3;
  JVar5.u.float64 = JVar4.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_chdir(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *target;
    int err;

    target = JS_ToCString(ctx, argv[0]);
    if (!target)
        return JS_EXCEPTION;
    err = js_get_errno(chdir(target));
    JS_FreeCString(ctx, target);
    return JS_NewInt32(ctx, err);
}